

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_test.cc
# Opt level: O0

void leveldb::log::_Test_TruncatedTrailingRecordIsIgnored::_RunIt(void)

{
  undefined1 local_98 [8];
  _Test_TruncatedTrailingRecordIsIgnored t;
  
  _Test_TruncatedTrailingRecordIsIgnored((_Test_TruncatedTrailingRecordIsIgnored *)local_98);
  _Run((_Test_TruncatedTrailingRecordIsIgnored *)local_98);
  ~_Test_TruncatedTrailingRecordIsIgnored((_Test_TruncatedTrailingRecordIsIgnored *)local_98);
  return;
}

Assistant:

TEST(LogTest, TruncatedTrailingRecordIsIgnored) {
  Write("foo");
  ShrinkSize(4);  // Drop all payload as well as a header byte
  ASSERT_EQ("EOF", Read());
  // Truncated last record is ignored, not treated as an error.
  ASSERT_EQ(0, DroppedBytes());
  ASSERT_EQ("", ReportMessage());
}